

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImageAPIOverrideTest::prepareUniforms
          (BindingImageAPIOverrideTest *this,program *program)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *pTVar3;
  buffer local_50;
  int local_38 [2];
  GLint binding;
  GLint local_24;
  long lStack_20;
  GLint uniform_location;
  Functions *gl;
  program *program_local;
  BindingImageAPIOverrideTest *this_local;
  
  gl = (Functions *)program;
  program_local = (program *)this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.
                      super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = Utils::program::getUniformLocation((program *)gl,"goku");
  if (local_24 == -1) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Uniform is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x32e8);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x14f0))(local_24,7);
  local_38[0] = -1;
  (**(code **)(lStack_20 + 0xb68))(*(undefined4 *)((long)&gl->activeTexture + 4),local_24,local_38);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"getUniformiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x32f0);
  if (local_38[0] != 7) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Wrong binding value",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x32f4);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  Utils::buffer::buffer
            (&local_50,
             (this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.
             m_context);
  BindingImageTest::prepareTexture
            (&this->super_BindingImageTest,&this->m_goku_texture,&local_50,TEX_2D,0xff,7);
  Utils::buffer::~buffer(&local_50);
  return;
}

Assistant:

void BindingImageAPIOverrideTest::prepareUniforms(Utils::program& program)
{
	static const GLuint goku_data   = 0x000000ff;
	static const GLint  new_binding = 7;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLint uniform_location = program.getUniformLocation("goku");
	if (-1 == uniform_location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	gl.uniform1i(uniform_location, new_binding);

	GLint binding = -1;

	gl.getUniformiv(program.m_program_object_id, uniform_location, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getUniformiv");

	if (new_binding != binding)
	{
		TCU_FAIL("Wrong binding value");
		return;
	}

	prepareTexture(m_goku_texture, Utils::buffer(m_context), Utils::TEX_2D, goku_data, new_binding);
}